

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_get_r13_banked_aarch64(CPUARMState_conflict *env,uint32_t mode)

{
  uint32_t syndrome;
  uint32_t target_el;
  int iVar1;
  uint32_t mode_local;
  CPUARMState_conflict *env_local;
  
  if ((env->uncached_cpsr & 0x1f) == 0x1f) {
    syndrome = syn_uncategorized();
    target_el = exception_target_el(env);
    raise_exception_aarch64(env,1,syndrome,target_el);
  }
  if ((env->uncached_cpsr & 0x1f) == mode) {
    env_local._4_4_ = env->regs[0xd];
  }
  else {
    iVar1 = bank_number(mode);
    env_local._4_4_ = env->banked_r13[iVar1];
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(get_r13_banked)(CPUARMState *env, uint32_t mode)
{
    if ((env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_SYS) {
        /* SRS instruction is UNPREDICTABLE from System mode; we UNDEF.
         * Other UNPREDICTABLE and UNDEF cases were caught at translate time.
         */
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }

    if ((env->uncached_cpsr & CPSR_M) == mode) {
        return env->regs[13];
    } else {
        return env->banked_r13[bank_number(mode)];
    }
}